

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermAggregate * __thiscall
glslang::TParseContext::handleFunctionDefinition
          (TParseContext *this,TSourceLoc *loc,TFunction *function)

{
  int *piVar1;
  TSymbolTable *this_00;
  char *__s;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TSymbol *pTVar6;
  long *plVar7;
  undefined4 extraout_var_02;
  TType *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TPoolAllocator *pTVar8;
  TIntermAggregate *this_02;
  undefined4 extraout_var_09;
  TVariable *this_03;
  TIntermSymbol *right;
  undefined4 extraout_var_10;
  TIntermediate *pTVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 local_c8 [152];
  undefined4 extraout_var_01;
  
  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[6])(function);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->currentCaller,
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            CONCAT44(extraout_var,iVar5));
  this_00 = (this->super_TParseContextBase).symbolTable;
  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[6])(function);
  pTVar6 = TSymbolTable::find(this_00,(TString *)CONCAT44(extraout_var_00,iVar5),(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  if (pTVar6 == (TSymbol *)0x0) {
LAB_004a3614:
    iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can\'t find function",*(undefined8 *)(CONCAT44(extraout_var_03,iVar5) + 8))
    ;
  }
  else {
    iVar5 = (*pTVar6->_vptr_TSymbol[7])(pTVar6);
    plVar7 = (long *)CONCAT44(extraout_var_01,iVar5);
    if (plVar7 == (long *)0x0) goto LAB_004a3614;
    cVar3 = (**(code **)(*plVar7 + 0xe8))(plVar7);
    if (cVar3 != '\0') {
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"function already has a body",
                 *(undefined8 *)(CONCAT44(extraout_var_02,iVar5) + 8));
    }
    cVar3 = (**(code **)(*plVar7 + 0xe8))(plVar7);
    if (cVar3 == '\0') {
      (**(code **)(*plVar7 + 0xe0))(plVar7);
      this_01 = (TType *)(**(code **)(*plVar7 + 0x60))(plVar7);
      goto LAB_004a3676;
    }
  }
  pTVar8 = GetThreadPoolAllocator();
  this_01 = (TType *)TPoolAllocator::allocate(pTVar8,0x98);
  TType::TType(this_01,EbtVoid,EvqTemporary,1,0,0,false);
LAB_004a3676:
  (this->super_TParseContextBase).currentFunctionType = this_01;
  (this->super_TParseContextBase).functionReturnsValue = false;
  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var_04,iVar5),
                  (((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                  entryPointName)._M_dataplus._M_p);
  if (iVar5 == 0) {
    pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[6])(function);
    __s = *(char **)(CONCAT44(extraout_var_05,iVar5) + 8);
    pcVar2 = (char *)(pTVar9->entryPointMangledName)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&pTVar9->entryPointMangledName,0,pcVar2,(ulong)__s);
    piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->numEntryPoints;
    *piVar1 = *piVar1 + 1;
    this->inMain = true;
    iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if (0 < iVar5) {
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"function cannot take any parameter(s)",
                 *(undefined8 *)(CONCAT44(extraout_var_06,iVar5) + 8));
    }
    iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
    iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar5) + 0x38))
                      ((long *)CONCAT44(extraout_var_07,iVar5));
    if (iVar5 != 0) {
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      TType::getBasicTypeString_abi_cxx11_
                ((TString *)local_c8,(TType *)CONCAT44(extraout_var_08,iVar5));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"",local_c8._8_8_);
    }
    if (function->linkType != ELinkNone) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"main function cannot be exported");
    }
  }
  else {
    this->inMain = false;
  }
  TSymbolTable::push((this->super_TParseContextBase).symbolTable);
  pTVar8 = GetThreadPoolAllocator();
  this_02 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar8,0x188);
  TIntermAggregate::TIntermAggregate(this_02);
  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar5) {
    uVar11 = 0;
    do {
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar11);
      plVar7 = (long *)CONCAT44(extraout_var_09,iVar5);
      if (*plVar7 == 0) {
        pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        right = TIntermediate::addSymbol(pTVar9,(TType *)plVar7[1],loc);
LAB_004a389c:
        this_02 = TIntermediate::growAggregate
                            (pTVar9,(TIntermNode *)this_02,(TIntermNode *)right,loc);
      }
      else {
        pTVar8 = GetThreadPoolAllocator();
        this_03 = (TVariable *)TPoolAllocator::allocate(pTVar8,0xf8);
        TVariable::TVariable(this_03,(TString *)*plVar7,(TString *)*plVar7,(TType *)plVar7[1],false)
        ;
        bVar4 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_03)
        ;
        if (bVar4) {
          *plVar7 = 0;
          pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          right = TIntermediate::addSymbol(pTVar9,this_03,loc);
          goto LAB_004a389c;
        }
        iVar5 = (*(this_03->super_TSymbol)._vptr_TSymbol[3])(this_03);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"redefinition",*(undefined8 *)(CONCAT44(extraout_var_10,iVar5) + 8));
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)uVar10 < iVar5);
  }
  this_02->linkType = function->linkType;
  pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
  TIntermediate::setAggregateOperator
            (pTVar9,(TIntermNode *)this_02,EOpParameters,(TType *)local_c8,loc);
  (this->super_TParseContextBase).statementNestingLevel = 0;
  (this->super_TParseContextBase).loopNestingLevel = 0;
  (this->super_TParseContextBase).controlFlowNestingLevel = 0;
  (this->super_TParseContextBase).postEntryPointReturn = false;
  return this_02;
}

Assistant:

TIntermAggregate* TParseContext::handleFunctionDefinition(const TSourceLoc& loc, TFunction& function)
{
    currentCaller = function.getMangledName();
    TSymbol* symbol = symbolTable.find(function.getMangledName());
    TFunction* prevDec = symbol ? symbol->getAsFunction() : nullptr;

    if (! prevDec)
        error(loc, "can't find function", function.getName().c_str(), "");
    // Note:  'prevDec' could be 'function' if this is the first time we've seen function
    // as it would have just been put in the symbol table.  Otherwise, we're looking up
    // an earlier occurrence.

    if (prevDec && prevDec->isDefined()) {
        // Then this function already has a body.
        error(loc, "function already has a body", function.getName().c_str(), "");
    }
    if (prevDec && ! prevDec->isDefined()) {
        prevDec->setDefined();

        // Remember the return type for later checking for RETURN statements.
        currentFunctionType = &(prevDec->getType());
    } else
        currentFunctionType = new TType(EbtVoid);
    functionReturnsValue = false;

    // Check for entry point
    if (function.getName().compare(intermediate.getEntryPointName().c_str()) == 0) {
        intermediate.setEntryPointMangledName(function.getMangledName().c_str());
        intermediate.incrementEntryPointCount();
        inMain = true;
    } else
        inMain = false;

    //
    // Raise error message if main function takes any parameters or returns anything other than void
    //
    if (inMain) {
        if (function.getParamCount() > 0)
            error(loc, "function cannot take any parameter(s)", function.getName().c_str(), "");
        if (function.getType().getBasicType() != EbtVoid)
            error(loc, "", function.getType().getBasicTypeString().c_str(), "entry point cannot return a value");
        if (function.getLinkType() != ELinkNone)
            error(loc, "main function cannot be exported", "", "");
    }

    //
    // New symbol table scope for body of function plus its arguments
    //
    symbolTable.push();

    //
    // Insert parameters into the symbol table.
    // If the parameter has no name, it's not an error, just don't insert it
    // (could be used for unused args).
    //
    // Also, accumulate the list of parameters into the HIL, so lower level code
    // knows where to find parameters.
    //
    TIntermAggregate* paramNodes = new TIntermAggregate;
    for (int i = 0; i < function.getParamCount(); i++) {
        TParameter& param = function[i];
        if (param.name != nullptr) {
            TVariable *variable = new TVariable(param.name, *param.type);

            // Insert the parameters with name in the symbol table.
            if (! symbolTable.insert(*variable))
                error(loc, "redefinition", variable->getName().c_str(), "");
            else {
                // Transfer ownership of name pointer to symbol table.
                param.name = nullptr;

                // Add the parameter to the HIL
                paramNodes = intermediate.growAggregate(paramNodes,
                                                        intermediate.addSymbol(*variable, loc),
                                                        loc);
            }
        } else
            paramNodes = intermediate.growAggregate(paramNodes, intermediate.addSymbol(*param.type, loc), loc);
    }
    paramNodes->setLinkType(function.getLinkType());
    intermediate.setAggregateOperator(paramNodes, EOpParameters, TType(EbtVoid), loc);
    loopNestingLevel = 0;
    statementNestingLevel = 0;
    controlFlowNestingLevel = 0;
    postEntryPointReturn = false;

    return paramNodes;
}